

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3AllocateMSI(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  int iVar1;
  u32 *__s;
  int iVar2;
  
  __s = pExpr->aMI;
  if (__s == (u32 *)0x0) {
    iVar2 = *(int *)((long)pCtx + 0x30);
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      __s = (u32 *)sqlite3Malloc((long)iVar2 * 0xc);
      pExpr->aMI = __s;
      if (__s != (u32 *)0x0) goto LAB_001d6e7d;
    }
    else {
      pExpr->aMI = (u32 *)0x0;
    }
    iVar2 = 7;
  }
  else {
LAB_001d6e7d:
    iVar2 = 0;
    memset(__s,0,(long)*(int *)((long)pCtx + 0x30) * 0xc);
  }
  return iVar2;
}

Assistant:

static int fts3AllocateMSI(Fts3Expr *pExpr, int iPhrase, void *pCtx){
  Fts3Table *pTab = (Fts3Table*)pCtx;
  UNUSED_PARAMETER(iPhrase);
  if( pExpr->aMI==0 ){
    pExpr->aMI = (u32 *)sqlite3_malloc64(pTab->nColumn * 3 * sizeof(u32));
    if( pExpr->aMI==0 ) return SQLITE_NOMEM;
  }
  memset(pExpr->aMI, 0, pTab->nColumn * 3 * sizeof(u32));
  return SQLITE_OK;
}